

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::fastpackwithoutmask_32(uint32_t *in,uint32_t *out,uint32_t bit)

{
  uint32_t *puVar1;
  logic_error *this;
  undefined4 in_register_00000014;
  
  puVar1 = (uint32_t *)CONCAT44(in_register_00000014,bit);
  switch(bit) {
  case 0:
    return out;
  case 1:
    puVar1 = __fastpackwithoutmask1_32(in,out);
    return puVar1;
  case 2:
    puVar1 = __fastpackwithoutmask2_32(in,out);
    return puVar1;
  case 3:
    puVar1 = __fastpackwithoutmask3_32(in,out);
    return puVar1;
  case 4:
    puVar1 = __fastpackwithoutmask4_32((FastPForLib *)in,out,puVar1);
    return puVar1;
  case 5:
    puVar1 = __fastpackwithoutmask5_32(in,out);
    return puVar1;
  case 6:
    puVar1 = __fastpackwithoutmask6_32(in,out);
    return puVar1;
  case 7:
    puVar1 = __fastpackwithoutmask7_32(in,out);
    return puVar1;
  case 8:
    puVar1 = __fastpackwithoutmask8_32((FastPForLib *)in,out,puVar1);
    return puVar1;
  case 9:
    puVar1 = __fastpackwithoutmask9_32(in,out);
    return puVar1;
  case 10:
    puVar1 = __fastpackwithoutmask10_32(in,out);
    return puVar1;
  case 0xb:
    puVar1 = __fastpackwithoutmask11_32(in,out);
    return puVar1;
  case 0xc:
    puVar1 = __fastpackwithoutmask12_32(in,out);
    return puVar1;
  case 0xd:
    puVar1 = __fastpackwithoutmask13_32(in,out);
    return puVar1;
  case 0xe:
    puVar1 = __fastpackwithoutmask14_32((FastPForLib *)in,out,puVar1);
    return puVar1;
  case 0xf:
    puVar1 = __fastpackwithoutmask15_32(in,out);
    return puVar1;
  case 0x10:
    puVar1 = __fastpackwithoutmask16_32(in,out);
    return puVar1;
  case 0x11:
    puVar1 = __fastpackwithoutmask17_32(in,out);
    return puVar1;
  case 0x12:
    puVar1 = __fastpackwithoutmask18_32(in,out);
    return puVar1;
  case 0x13:
    puVar1 = __fastpackwithoutmask19_32(in,out);
    return puVar1;
  case 0x14:
    puVar1 = __fastpackwithoutmask20_32(in,out);
    return puVar1;
  case 0x15:
    puVar1 = __fastpackwithoutmask21_32(in,out);
    return puVar1;
  case 0x16:
    puVar1 = __fastpackwithoutmask22_32((FastPForLib *)in,out,puVar1);
    return puVar1;
  case 0x17:
    puVar1 = __fastpackwithoutmask23_32(in,out);
    return puVar1;
  case 0x18:
    puVar1 = __fastpackwithoutmask24_32(in,out);
    return puVar1;
  case 0x19:
    puVar1 = __fastpackwithoutmask25_32(in,out);
    return puVar1;
  case 0x1a:
    puVar1 = __fastpackwithoutmask26_32(in,out);
    return puVar1;
  case 0x1b:
    puVar1 = __fastpackwithoutmask27_32((FastPForLib *)in,out,puVar1);
    return puVar1;
  case 0x1c:
    puVar1 = __fastpackwithoutmask28_32(in,out);
    return puVar1;
  case 0x1d:
    puVar1 = __fastpackwithoutmask29_32((FastPForLib *)in,out,puVar1);
    return puVar1;
  case 0x1e:
    puVar1 = __fastpackwithoutmask30_32(in,out);
    return puVar1;
  case 0x1f:
    puVar1 = __fastpackwithoutmask31_32(in,out);
    return puVar1;
  case 0x20:
    puVar1 = __fastpackwithoutmask32_32(in,out);
    return puVar1;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"number of bits is unsupported");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
}

Assistant:

uint32_t *fastpackwithoutmask_32(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out,
                                 const uint32_t bit) {
  switch (bit) {
  case 0:
    return nullpacker(in, out);

  case 1:
    return __fastpackwithoutmask1_32(in, out);

  case 2:
    return __fastpackwithoutmask2_32(in, out);

  case 3:
    return __fastpackwithoutmask3_32(in, out);

  case 4:
    return __fastpackwithoutmask4_32(in, out);

  case 5:
    return __fastpackwithoutmask5_32(in, out);

  case 6:
    return __fastpackwithoutmask6_32(in, out);

  case 7:
    return __fastpackwithoutmask7_32(in, out);

  case 8:
    return __fastpackwithoutmask8_32(in, out);

  case 9:
    return __fastpackwithoutmask9_32(in, out);

  case 10:
    return __fastpackwithoutmask10_32(in, out);

  case 11:
    return __fastpackwithoutmask11_32(in, out);

  case 12:
    return __fastpackwithoutmask12_32(in, out);

  case 13:
    return __fastpackwithoutmask13_32(in, out);

  case 14:
    return __fastpackwithoutmask14_32(in, out);

  case 15:
    return __fastpackwithoutmask15_32(in, out);

  case 16:
    return __fastpackwithoutmask16_32(in, out);

  case 17:
    return __fastpackwithoutmask17_32(in, out);

  case 18:
    return __fastpackwithoutmask18_32(in, out);

  case 19:
    return __fastpackwithoutmask19_32(in, out);

  case 20:
    return __fastpackwithoutmask20_32(in, out);

  case 21:
    return __fastpackwithoutmask21_32(in, out);

  case 22:
    return __fastpackwithoutmask22_32(in, out);

  case 23:
    return __fastpackwithoutmask23_32(in, out);

  case 24:
    return __fastpackwithoutmask24_32(in, out);

  case 25:
    return __fastpackwithoutmask25_32(in, out);

  case 26:
    return __fastpackwithoutmask26_32(in, out);

  case 27:
    return __fastpackwithoutmask27_32(in, out);

  case 28:
    return __fastpackwithoutmask28_32(in, out);

  case 29:
    return __fastpackwithoutmask29_32(in, out);

  case 30:
    return __fastpackwithoutmask30_32(in, out);

  case 31:
    return __fastpackwithoutmask31_32(in, out);

  case 32:
    return __fastpackwithoutmask32_32(in, out);

  default:
    break;
  }
  throw std::logic_error("number of bits is unsupported");
}